

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsTestDriver.cpp
# Opt level: O3

void __thiscall xs::TestDriver::TestDriver(TestDriver *this,TestProcess *testProcess)

{
  value_type_conflict1 *__val;
  pointer __s;
  
  this->m_state = STATE_NOT_STARTED;
  (this->m_lastLaunchFailure)._M_dataplus._M_p = (pointer)&(this->m_lastLaunchFailure).field_2;
  (this->m_lastLaunchFailure)._M_string_length = 0;
  (this->m_lastLaunchFailure).field_2._M_local_buf[0] = '\0';
  this->m_lastExitCode = 0;
  this->m_process = testProcess;
  this->m_lastProcessDataTime = 0;
  (this->m_dataMsgTmpBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_dataMsgTmpBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_dataMsgTmpBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s = (pointer)operator_new(0x1000);
  (this->m_dataMsgTmpBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = __s;
  (this->m_dataMsgTmpBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __s + 0x1000;
  memset(__s,0,0x1000);
  (this->m_dataMsgTmpBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = __s + 0x1000;
  return;
}

Assistant:

TestDriver::TestDriver (xs::TestProcess* testProcess)
	: m_state				(STATE_NOT_STARTED)
	, m_lastExitCode		(0)
	, m_process				(testProcess)
	, m_lastProcessDataTime	(0)
	, m_dataMsgTmpBuf		(SEND_RECV_TMP_BUFFER_SIZE)
{
}